

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReaderWriter.h
# Opt level: O2

int __thiscall JetHead::IReaderWriter::readAll(IReaderWriter *this,void *buffer,int length)

{
  int iVar1;
  int bytesRead;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (length <= (int)uVar2) {
      return uVar2;
    }
    iVar1 = (*this->_vptr_IReaderWriter[2])(this,(ulong)uVar2 + (long)buffer);
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      return uVar2;
    }
    uVar2 = uVar2 + iVar1;
  }
  return iVar1;
}

Assistant:

virtual int readAll(void *buffer, int length)
		{
			int bytesRead = 0;
			
			while (bytesRead < length)
			{
				int result = read((uint8_t*)buffer + bytesRead,
								  length - bytesRead);
				
				if (result < 0)
					return result;
				
				if (result == 0)
					return bytesRead;
				
				bytesRead += result;
			}
			return bytesRead;
		}